

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_21(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  shared_ptr<LNode> local_d0;
  shared_ptr<LNode> local_c0;
  shared_ptr<LNode> local_b0;
  LNodeExpr local_a0;
  undefined4 local_6c;
  shared_ptr<LNodeData<LNodeExpr>_> r;
  shared_ptr<LNode> expr0;
  undefined1 local_38 [8];
  shared_ptr<LNode> op;
  shared_ptr<LNode> atom;
  LParser *this_local;
  
  get_node((LParser *)&op.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,in_ESI);
  get_node((LParser *)local_38,in_ESI);
  get_node((LParser *)
           &r.super___shared_ptr<LNodeData<LNodeExpr>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  local_6c = 0x28;
  std::shared_ptr<LNode>::shared_ptr(&local_b0,(shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::shared_ptr
            (&local_c0,
             (shared_ptr<LNode> *)
             &op.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr
            (&local_d0,
             (shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeExpr>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  LNodeExpr::LNodeExpr(&local_a0,&local_b0,&local_c0,&local_d0);
  std::make_shared<LNodeData<LNodeExpr>,LNodeType,LNodeExpr>
            ((LNodeType *)&stack0xffffffffffffff98,(LNodeExpr *)&stack0xffffffffffffff94);
  LNodeExpr::~LNodeExpr(&local_a0);
  std::shared_ptr<LNode>::~shared_ptr(&local_d0);
  std::shared_ptr<LNode>::~shared_ptr(&local_c0);
  std::shared_ptr<LNode>::~shared_ptr(&local_b0);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeExpr>,void>
            ((shared_ptr<LNode> *)this,(shared_ptr<LNodeData<LNodeExpr>_> *)&stack0xffffffffffffff98
            );
  std::shared_ptr<LNodeData<LNodeExpr>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeExpr>_> *)&stack0xffffffffffffff98);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeExpr>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &op.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_21() {
    // Expr0 : Atom BinOP0 Expr0
    auto atom = this->get_node(3);
    auto op = this->get_node(2);
    auto expr0 = this->get_node(1);
    auto r = std::make_shared<LNodeData<LNodeExpr>>(LNodeType::Expr, LNodeExpr(op, atom, expr0));
    return r;
}